

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O1

Result __thiscall
wabt::WastParser::ParseCommandList(WastParser *this,Script *script,CommandPtrVector *commands)

{
  TokenType TVar1;
  TokenType TVar2;
  Result RVar3;
  bool bVar4;
  CommandPtr command;
  _Head_base<0UL,_wabt::Command_*,_false> local_40;
  vector<std::unique_ptr<wabt::Command,std::default_delete<wabt::Command>>,std::allocator<std::unique_ptr<wabt::Command,std::default_delete<wabt::Command>>>>
  *local_38;
  
  local_38 = (vector<std::unique_ptr<wabt::Command,std::default_delete<wabt::Command>>,std::allocator<std::unique_ptr<wabt::Command,std::default_delete<wabt::Command>>>>
              *)commands;
  do {
    TVar1 = Peek(this,0);
    TVar2 = Peek(this,1);
    if (TVar1 != Lpar) {
      return (Result)Ok;
    }
    if (Register < TVar2) {
      return (Result)Ok;
    }
    if ((0x1022400fcU >> ((ulong)TVar2 & 0x3f) & 1) == 0) {
      return (Result)Ok;
    }
    local_40._M_head_impl = (Command *)0x0;
    RVar3 = ParseCommand(this,script,(CommandPtr *)&local_40);
    if (RVar3.enum_ == Ok) {
      std::
      vector<std::unique_ptr<wabt::Command,std::default_delete<wabt::Command>>,std::allocator<std::unique_ptr<wabt::Command,std::default_delete<wabt::Command>>>>
      ::emplace_back<std::unique_ptr<wabt::Command,std::default_delete<wabt::Command>>>
                (local_38,(unique_ptr<wabt::Command,_std::default_delete<wabt::Command>_> *)
                          &local_40);
      bVar4 = true;
    }
    else {
      RVar3 = Synchronize(this,anon_unknown_1::IsCommand);
      bVar4 = RVar3.enum_ != Error;
    }
    if (local_40._M_head_impl != (Command *)0x0) {
      (*(local_40._M_head_impl)->_vptr_Command[1])();
    }
  } while (bVar4);
  return (Result)Error;
}

Assistant:

Result WastParser::ParseCommandList(Script* script,
                                    CommandPtrVector* commands) {
  WABT_TRACE(ParseCommandList);
  while (IsCommand(PeekPair())) {
    CommandPtr command;
    if (Succeeded(ParseCommand(script, &command))) {
      commands->push_back(std::move(command));
    } else {
      CHECK_RESULT(Synchronize(IsCommand));
    }
  }
  return Result::Ok;
}